

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O0

void __thiscall
llm_build_arctic::llm_build_arctic
          (llm_build_arctic *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  uint uVar1;
  ggml_tensor *pgVar2;
  ggml_tensor *v_cur;
  ggml_tensor *pgVar3;
  ggml_tensor *pgVar4;
  ggml_tensor *pgVar5;
  ggml_tensor *pgVar6;
  ggml_tensor *pgVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  llm_graph_input_attn_kv_unified *inp;
  ggml_cgraph *pgVar10;
  ggml_tensor *pgVar11;
  ggml_tensor *n_expert;
  ggml_tensor *exp_probs_b;
  const_reference pvVar12;
  pointer plVar13;
  undefined8 in_RCX;
  long in_RSI;
  long in_RDI;
  ggml_tensor *ffn_out;
  ggml_tensor *ffn_inp;
  ggml_tensor *inp_out_ids;
  ggml_tensor *Vcur;
  ggml_tensor *Kcur;
  ggml_tensor *Qcur;
  ggml_tensor *inpSA;
  int il;
  llm_graph_input_attn_kv_unified *inp_attn;
  ggml_tensor *inp_pos;
  ggml_tensor *inpL;
  ggml_tensor *cur;
  int64_t n_embd_head;
  ggml_tensor *in_stack_fffffffffffffd98;
  int iVar14;
  llm_graph_context *in_stack_fffffffffffffda0;
  ggml_backend_buffer *name;
  ggml_tensor *in_stack_fffffffffffffda8;
  ggml_tensor *in_stack_fffffffffffffdb0;
  ggml_tensor *pgVar15;
  ggml_tensor *in_stack_fffffffffffffdb8;
  undefined4 uVar17;
  ggml_tensor *pgVar16;
  llm_graph_context *in_stack_fffffffffffffdc0;
  ggml_tensor *in_stack_fffffffffffffdf0;
  ggml_tensor *in_stack_fffffffffffffdf8;
  llm_graph_context *in_stack_fffffffffffffe00;
  ggml_tensor *in_stack_fffffffffffffe18;
  ggml_tensor *in_stack_fffffffffffffe20;
  ggml_tensor *in_stack_fffffffffffffe28;
  ggml_tensor *in_stack_fffffffffffffe30;
  ggml_tensor *in_stack_fffffffffffffe38;
  ggml_tensor *in_stack_fffffffffffffe40;
  ggml_tensor *in_stack_fffffffffffffe50;
  ggml_tensor *in_stack_fffffffffffffe58;
  llm_ffn_op_type type_op;
  ggml_tensor *in_stack_fffffffffffffe80;
  llm_ffn_gate_type type_gate;
  ggml_tensor *in_stack_fffffffffffffea0;
  ggml_tensor *in_stack_fffffffffffffea8;
  llm_graph_context *in_stack_fffffffffffffeb0;
  llama_expert_gating_func_type gating_op;
  ggml_cgraph *pgVar18;
  int il_00;
  ggml_tensor *in_stack_ffffffffffffff60;
  float kq_scale;
  ggml_tensor *in_stack_ffffffffffffff68;
  ggml_tensor *in_stack_ffffffffffffff70;
  ggml_cgraph *gf_00;
  int local_64;
  int in_stack_ffffffffffffffc0;
  
  llm_graph_context::llm_graph_context
            ((llm_graph_context *)in_stack_fffffffffffffdb0,
             (llm_graph_params *)in_stack_fffffffffffffda8);
  uVar1 = *(uint *)(*(long *)(in_RDI + 8) + 0x24);
  if (uVar1 != *(uint *)(*(long *)(in_RDI + 8) + 0x20)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
               ,0x2609,"GGML_ASSERT(%s) failed","n_embd_head == hparams.n_embd_head_k");
  }
  if (uVar1 != *(uint *)(*(long *)(in_RDI + 8) + 0x14)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
               ,0x260a,"GGML_ASSERT(%s) failed","n_embd_head == hparams.n_rot");
  }
  pgVar2 = llm_graph_context::build_inp_embd(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  v_cur = llm_graph_context::build_inp_pos(in_stack_fffffffffffffe00);
  pgVar3 = (ggml_tensor *)
           llm_graph_context::build_attn_inp_kv_unified
                     ((llm_graph_context *)in_stack_fffffffffffffe40);
  for (local_64 = 0; type_op = (llm_ffn_op_type)in_stack_fffffffffffffe80,
      kq_scale = (float)((ulong)in_stack_ffffffffffffff60 >> 0x20),
      iVar14 = (int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
      (long)local_64 < *(long *)(in_RDI + 0x28); local_64 = local_64 + 1) {
    pgVar11 = pgVar2;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_64
              );
    pgVar4 = llm_graph_context::build_norm
                       (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                        in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                        (llm_norm_type)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                        (int)in_stack_fffffffffffffda0);
    uVar17 = (undefined4)((ulong)in_stack_fffffffffffffdb8 >> 0x20);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
               (char *)in_stack_fffffffffffffda0,iVar14);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_64
              );
    pgVar5 = llm_graph_context::build_lora_mm
                       (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                        in_stack_fffffffffffffdf0);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
               (char *)in_stack_fffffffffffffda0,iVar14);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_64
              );
    pgVar6 = llm_graph_context::build_lora_mm
                       (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                        in_stack_fffffffffffffdf0);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
               (char *)in_stack_fffffffffffffda0,iVar14);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_64
              );
    pgVar7 = llm_graph_context::build_lora_mm
                       (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                        in_stack_fffffffffffffdf0);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
               (char *)in_stack_fffffffffffffda0,iVar14);
    uVar8 = ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),pgVar5,uVar1,
                            *(undefined8 *)(in_RDI + 0x48),(long)*(int *)(in_RDI + 0xa8));
    uVar9 = ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),pgVar6,uVar1,
                            *(undefined8 *)(in_RDI + 0x50),(long)*(int *)(in_RDI + 0xa8));
    pgVar6 = (ggml_tensor *)
             ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),pgVar7,uVar1,
                             *(undefined8 *)(in_RDI + 0x50),(long)*(int *)(in_RDI + 0xa8));
    inp = (llm_graph_input_attn_kv_unified *)
          ggml_rope_ext(*(undefined4 *)(in_RDI + 0x88),*(undefined4 *)(in_RDI + 0x8c),
                        *(undefined4 *)(in_RDI + 0x90),*(undefined4 *)(in_RDI + 0x94),
                        *(undefined4 *)(in_RDI + 0x98),*(undefined4 *)(in_RDI + 0x9c),
                        *(undefined8 *)(in_RDI + 0xc0),uVar8,v_cur,0,*(undefined4 *)(in_RDI + 0x30),
                        *(undefined4 *)(in_RDI + 0xb8));
    pgVar10 = (ggml_cgraph *)
              ggml_rope_ext(*(undefined4 *)(in_RDI + 0x88),*(undefined4 *)(in_RDI + 0x8c),
                            *(undefined4 *)(in_RDI + 0x90),*(undefined4 *)(in_RDI + 0x94),
                            *(undefined4 *)(in_RDI + 0x98),*(undefined4 *)(in_RDI + 0x9c),
                            *(undefined8 *)(in_RDI + 0xc0),uVar9,v_cur,0,
                            *(undefined4 *)(in_RDI + 0x30),*(undefined4 *)(in_RDI + 0xb8));
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
               (char *)in_stack_fffffffffffffda0,iVar14);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
               (char *)in_stack_fffffffffffffda0,iVar14);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
               (char *)in_stack_fffffffffffffda0,iVar14);
    pgVar5 = pgVar3;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_64
              );
    il_00 = (int)pgVar3;
    pgVar3 = pgVar6;
    gf_00 = pgVar10;
    sqrtf((float)uVar1);
    pgVar16 = (ggml_tensor *)CONCAT44(uVar17,local_64);
    pgVar15 = (ggml_tensor *)0x0;
    pgVar7 = (ggml_tensor *)0x0;
    pgVar18 = pgVar10;
    pgVar11 = llm_graph_context::build_attn
                        ((llm_graph_context *)pgVar2,inp,gf_00,pgVar3,in_stack_ffffffffffffff70,
                         in_stack_ffffffffffffff68,pgVar5,v_cur,pgVar11,pgVar4,kq_scale,
                         in_stack_ffffffffffffffc0);
    gating_op = (llama_expert_gating_func_type)pgVar18;
    iVar14 = (int)((ulong)pgVar10 >> 0x20);
    pgVar3 = pgVar5;
    if ((long)local_64 == *(long *)(in_RDI + 0x28) + -1) {
      in_stack_ffffffffffffff70 =
           llm_graph_context::build_inp_out_ids((llm_graph_context *)in_stack_fffffffffffffdf0);
      in_stack_fffffffffffffea8 =
           (ggml_tensor *)
           ggml_get_rows(*(undefined8 *)(in_RDI + 0xc0),pgVar11,in_stack_ffffffffffffff70);
      pgVar11 = in_stack_fffffffffffffea8;
      in_stack_fffffffffffffea0 =
           (ggml_tensor *)
           ggml_get_rows(*(undefined8 *)(in_RDI + 0xc0),pgVar2,in_stack_ffffffffffffff70);
      pgVar2 = in_stack_fffffffffffffea0;
      pgVar3 = pgVar5;
    }
    n_expert = (ggml_tensor *)ggml_add(*(undefined8 *)(in_RDI + 0xc0),pgVar11,pgVar2);
    pgVar2 = n_expert;
    llm_graph_context::cb((llm_graph_context *)pgVar15,pgVar7,(char *)pgVar6,iVar14);
    in_stack_ffffffffffffff68 = pgVar2;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_64
              );
    type_gate = (llm_ffn_gate_type)pgVar2;
    exp_probs_b = llm_graph_context::build_norm
                            (in_stack_fffffffffffffdc0,pgVar16,pgVar15,pgVar7,
                             (llm_norm_type)((ulong)pgVar6 >> 0x20),(int)pgVar6);
    pgVar16 = exp_probs_b;
    llm_graph_context::cb((llm_graph_context *)pgVar15,pgVar7,(char *)pgVar6,iVar14);
    pvVar12 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                        ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                         (long)local_64);
    pgVar2 = pvVar12->ffn_up;
    pvVar12 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                        ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                         (long)local_64);
    pgVar5 = pvVar12->ffn_gate;
    pvVar12 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                        ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                         (long)local_64);
    pgVar11 = pvVar12->ffn_down;
    in_stack_fffffffffffffdc0 = (llm_graph_context *)0x0;
    pgVar15 = (ggml_tensor *)0x0;
    pgVar7 = (ggml_tensor *)0x0;
    name = (ggml_backend_buffer *)0x0;
    iVar14 = 0;
    pgVar4 = (ggml_tensor *)&stack0xfffffffffffffd98;
    in_stack_fffffffffffffe80 =
         llm_graph_context::build_ffn
                   ((llm_graph_context *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                    in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                    in_stack_fffffffffffffe18,in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,
                    pgVar16,pgVar2,pgVar5,(ggml_tensor *)&stack0xfffffffffffffd98,type_op,type_gate,
                    (int)exp_probs_b);
    pgVar6 = in_stack_fffffffffffffe80;
    llm_graph_context::cb((llm_graph_context *)pgVar7,pgVar11,(char *)name,iVar14);
    in_stack_fffffffffffffe58 =
         (ggml_tensor *)ggml_add(*(undefined8 *)(in_RDI + 0xc0),pgVar6,in_stack_ffffffffffffff68);
    in_stack_ffffffffffffff60 = in_stack_fffffffffffffe58;
    llm_graph_context::cb((llm_graph_context *)pgVar7,pgVar11,(char *)name,iVar14);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_64
              );
    in_stack_fffffffffffffe50 =
         llm_graph_context::build_norm
                   (in_stack_fffffffffffffdc0,pgVar15,pgVar7,pgVar11,
                    (llm_norm_type)((ulong)name >> 0x20),(int)name);
    uVar17 = (undefined4)((ulong)pgVar15 >> 0x20);
    in_stack_fffffffffffffe18 = in_stack_fffffffffffffe50;
    llm_graph_context::cb((llm_graph_context *)pgVar7,pgVar11,(char *)name,iVar14);
    pvVar12 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                        ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                         (long)local_64);
    in_stack_fffffffffffffe20 = pvVar12->ffn_gate_inp;
    pvVar12 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                        ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                         (long)local_64);
    in_stack_fffffffffffffe28 = pvVar12->ffn_up_exps;
    pvVar12 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                        ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                         (long)local_64);
    in_stack_fffffffffffffe30 = pvVar12->ffn_gate_exps;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_64
              );
    in_stack_fffffffffffffda0 = *(llm_graph_context **)(in_RDI + 0x78);
    in_stack_fffffffffffffda8 = *(ggml_tensor **)(in_RDI + 0x80);
    in_stack_fffffffffffffdc0 =
         (llm_graph_context *)((ulong)in_stack_fffffffffffffdc0 & 0xffffffff00000000);
    in_stack_fffffffffffffdb8 = (ggml_tensor *)CONCAT44(uVar17,1);
    in_stack_fffffffffffffdb0 = (ggml_tensor *)((ulong)pgVar7 & 0xffffffff00000000);
    in_stack_fffffffffffffd98 = (ggml_tensor *)0x0;
    in_stack_fffffffffffffe38 = (ggml_tensor *)&stack0xfffffffffffffd98;
    in_stack_fffffffffffffe40 =
         llm_graph_context::build_moe_ffn
                   ((llm_graph_context *)in_stack_fffffffffffffe80,pgVar4,pgVar5,pgVar2,pgVar16,
                    in_stack_fffffffffffffe58,exp_probs_b,(int64_t)n_expert,
                    (int64_t)in_stack_fffffffffffffea0,(llm_ffn_op_type)in_stack_fffffffffffffea8,
                    SUB81((ulong)in_stack_fffffffffffffe50 >> 0x38,0),
                    SUB81((ulong)in_stack_fffffffffffffe50 >> 0x30,0),
                    SUB84(in_stack_fffffffffffffe50,0),gating_op,il_00);
    pgVar2 = in_stack_fffffffffffffe40;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
               (char *)in_stack_fffffffffffffda0,(int)((ulong)in_stack_fffffffffffffd98 >> 0x20));
    ggml_add(*(undefined8 *)(in_RDI + 0xc0),pgVar2,in_stack_ffffffffffffff60);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
               (char *)in_stack_fffffffffffffda0,(int)((ulong)in_stack_fffffffffffffd98 >> 0x20));
    pgVar2 = llm_graph_context::build_cvec(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,0);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
               (char *)in_stack_fffffffffffffda0,(int)((ulong)in_stack_fffffffffffffd98 >> 0x20));
  }
  pgVar3 = llm_graph_context::build_norm
                     (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,
                      in_stack_fffffffffffffda8,
                      (llm_norm_type)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                      (int)in_stack_fffffffffffffda0);
  pgVar2 = pgVar3;
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
             (char *)in_stack_fffffffffffffda0,iVar14);
  plVar13 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x4eaf13);
  plVar13->t_embd = pgVar2;
  pgVar3 = llm_graph_context::build_lora_mm
                     ((llm_graph_context *)pgVar3,in_stack_fffffffffffffdf8,pgVar2);
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
             (char *)in_stack_fffffffffffffda0,iVar14);
  pgVar2 = pgVar3;
  plVar13 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x4eaf98);
  plVar13->t_logits = pgVar3;
  ggml_build_forward_expand(in_RCX,pgVar2);
  return;
}

Assistant:

llm_build_arctic(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        const int64_t n_embd_head = hparams.n_embd_head_v;

        GGML_ASSERT(n_embd_head == hparams.n_embd_head_k);
        GGML_ASSERT(n_embd_head == hparams.n_rot);

        ggml_tensor * cur;
        ggml_tensor * inpL;

        inpL = build_inp_embd(model.tok_embd);

        // inp_pos - contains the positions
        ggml_tensor * inp_pos = build_inp_pos();

        auto * inp_attn = build_attn_inp_kv_unified();

        for (int il = 0; il < n_layer; ++il) {
            ggml_tensor * inpSA = inpL;

            // norm
            cur = build_norm(inpL,
                    model.layers[il].attn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "attn_norm", il);

            // self-attention
            {
                // compute Q and K and RoPE them
                ggml_tensor * Qcur = build_lora_mm(model.layers[il].wq, cur);
                cb(Qcur, "Qcur", il);

                ggml_tensor * Kcur = build_lora_mm(model.layers[il].wk, cur);
                cb(Kcur, "Kcur", il);

                ggml_tensor * Vcur = build_lora_mm(model.layers[il].wv, cur);
                cb(Vcur, "Vcur", il);

                Qcur = ggml_reshape_3d(ctx0, Qcur, n_embd_head, n_head,    n_tokens);
                Kcur = ggml_reshape_3d(ctx0, Kcur, n_embd_head, n_head_kv, n_tokens);
                Vcur = ggml_reshape_3d(ctx0, Vcur, n_embd_head, n_head_kv, n_tokens);

                Qcur = ggml_rope_ext(
                        ctx0, Qcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                Kcur = ggml_rope_ext(
                        ctx0, Kcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                cb(Qcur, "Qcur", il);
                cb(Kcur, "Kcur", il);
                cb(Vcur, "Vcur", il);

                cur = build_attn(inp_attn, gf,
                        model.layers[il].wo, NULL,
                        Qcur, Kcur, Vcur, nullptr, nullptr, 1.0f/sqrtf(float(n_embd_head)), il);
            }

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur   = ggml_get_rows(ctx0,   cur, inp_out_ids);
                inpSA = ggml_get_rows(ctx0, inpSA, inp_out_ids);
            }

            ggml_tensor * ffn_inp = ggml_add(ctx0, cur, inpSA);
            cb(ffn_inp, "ffn_inp", il);

            // feed-forward network
            cur = build_norm(ffn_inp,
                    model.layers[il].ffn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "ffn_norm", il);

            cur = build_ffn(cur,
                    model.layers[il].ffn_up,   NULL, NULL,
                    model.layers[il].ffn_gate, NULL, NULL,
                    model.layers[il].ffn_down, NULL, NULL,
                    NULL,
                    LLM_FFN_SILU, LLM_FFN_PAR, il);
            cb(cur, "ffn_out", il);

            ggml_tensor * ffn_out = ggml_add(ctx0, cur, ffn_inp);
            cb(ffn_out, "ffn_out", il);

            // MoE
            cur = build_norm(inpSA,
                    model.layers[il].ffn_norm_exps, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "ffn_norm_exps", il);

            cur = build_moe_ffn(cur,
                    model.layers[il].ffn_gate_inp,
                    model.layers[il].ffn_up_exps,
                    model.layers[il].ffn_gate_exps,
                    model.layers[il].ffn_down_exps,
                    nullptr,
                    n_expert, n_expert_used,
                    LLM_FFN_SILU, true,
                    false, 0.0,
                    LLAMA_EXPERT_GATING_FUNC_TYPE_SOFTMAX,
                    il);
            cb(cur, "ffn_moe_out", il);

            cur = ggml_add(ctx0, cur, ffn_out);
            cb(cur, "ffn_out", il);

            cur = build_cvec(cur, il);
            cb(cur, "l_out", il);

            // input for next layer
            inpL = cur;
        }

        cur = inpL;

        cur = build_norm(cur,
                model.output_norm, NULL,
                LLM_NORM_RMS, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        // lm_head
        cur = build_lora_mm(model.output, cur);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }